

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vec<6U,_float>_>::reserve
          (vector<crnlib::vec<6U,_float>_> *this,uint new_capacity)

{
  uint in_ESI;
  vector<crnlib::vec<6U,_float>_> *in_RDI;
  vector<crnlib::vec<6U,_float>_> tmp;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbb;
  uint in_stack_ffffffffffffffbc;
  vector<crnlib::vec<6U,_float>_> *in_stack_ffffffffffffffc0;
  vector<crnlib::vec<6U,_float>_> *this_00;
  vector<crnlib::vec<6U,_float>_> local_20;
  uint local_c;
  
  if (in_RDI->m_capacity < in_ESI) {
    increase_capacity(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                      (bool)in_stack_ffffffffffffffbb,(bool)in_stack_ffffffffffffffba);
  }
  else if (in_ESI < in_RDI->m_capacity) {
    this_00 = &local_20;
    local_c = in_ESI;
    vector(this_00);
    math::maximum<unsigned_int>(in_RDI->m_size,local_c);
    increase_capacity(this_00,in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb,
                      (bool)in_stack_ffffffffffffffba);
    operator=(in_RDI,this_00);
    swap(this_00,(vector<crnlib::vec<6U,_float>_> *)
                 CONCAT44(in_stack_ffffffffffffffbc,
                          CONCAT13(in_stack_ffffffffffffffbb,
                                   CONCAT12(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8))));
    ~vector(this_00);
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity) {
    if (new_capacity > m_capacity)
      increase_capacity(new_capacity, false);
    else if (new_capacity < m_capacity) {
      // Must work around the lack of a "decrease_capacity()" method.
      // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
      vector tmp;
      tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
      tmp = *this;
      swap(tmp);
    }
  }